

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void add_include_stream(c2m_ctx_t c2m_ctx,char *fname,char *content,pos_t err_pos)

{
  pre_ctx *ppVar1;
  VARR_char_ptr_t *pVVar2;
  size_t sVar3;
  stream_t psVar4;
  int iVar5;
  undefined4 extraout_var;
  pre_ctx *extraout_RAX;
  pre_ctx *f;
  c2m_ctx_t unaff_RBX;
  size_t sVar6;
  char *unaff_R14;
  char *unaff_R15;
  
  ppVar1 = c2m_ctx->pre_ctx;
  pVVar2 = ppVar1->once_include_files;
  if (pVVar2 != (VARR_char_ptr_t *)0x0) {
    sVar3 = pVVar2->els_num;
    sVar6 = 0;
    f = ppVar1;
    do {
      unaff_RBX = c2m_ctx;
      unaff_R14 = fname;
      unaff_R15 = content;
      if (sVar3 == sVar6) goto LAB_00194bee;
      if (pVVar2->varr == (char_ptr_t *)0x0) {
        add_include_stream_cold_1();
        goto LAB_00194c7c;
      }
      iVar5 = strcmp(fname,pVVar2->varr[sVar6]);
      f = (pre_ctx *)CONCAT44(extraout_var,iVar5);
      if (iVar5 == 0) {
        return;
      }
      sVar6 = sVar6 + 1;
    } while (pVVar2 != (VARR_char_ptr_t *)0x0);
  }
  add_include_stream_cold_3();
  f = extraout_RAX;
LAB_00194bee:
  if (unaff_R14 != (char *)0x0) {
    if ((unaff_R15 != (char *)0x0) || (f = (pre_ctx *)fopen(unaff_R14,"rb"), f != (pre_ctx *)0x0)) {
      if (unaff_R15 == (char *)0x0) {
        add_stream(unaff_RBX,(FILE *)f,unaff_R14,(_func_int_c2m_ctx_t *)0x0);
      }
      else {
        add_stream(unaff_RBX,(FILE *)0x0,unaff_R14,str_getc);
        psVar4 = unaff_RBX->cs;
        psVar4->curr = unaff_R15;
        psVar4->start = unaff_R15;
      }
      if (ppVar1->ifs != (VARR_ifstate_t *)0x0) {
        unaff_RBX->cs->ifs_length_at_stream_start = (int)ppVar1->ifs->els_num;
        return;
      }
      add_include_stream_cold_2();
    }
    if (unaff_RBX->options->message_file != (FILE *)0x0) {
      error(unaff_RBX,0x1c34f7,err_pos.fname,err_pos._8_8_,unaff_R14);
    }
    longjmp((__jmp_buf_tag *)unaff_RBX->env,1);
  }
LAB_00194c7c:
  __assert_fail("fname != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x89b,"void add_include_stream(c2m_ctx_t, const char *, const char *, pos_t)");
}

Assistant:

static void add_include_stream (c2m_ctx_t c2m_ctx, const char *fname, const char *content,
                                pos_t err_pos) {
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;
  FILE *f;

  for (size_t i = 0; i < VARR_LENGTH (char_ptr_t, once_include_files); i++)
    if (strcmp (fname, VARR_GET (char_ptr_t, once_include_files, i)) == 0) return;
  assert (fname != NULL);
  if (content == NULL && (f = fopen (fname, "rb")) == NULL) {
    if (c2m_options->message_file != NULL)
      error (c2m_ctx, err_pos, "error in opening file %s", fname);
    longjmp (c2m_ctx->env, 1);  // ???
  }
  if (content == NULL)
    add_stream (c2m_ctx, f, fname, NULL);
  else
    add_string_stream (c2m_ctx, fname, content);
  cs->ifs_length_at_stream_start = (int) VARR_LENGTH (ifstate_t, ifs);
}